

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

_Bool IsFileExtension(char *fileName,char *ext)

{
  _Bool _Var1;
  char *pcVar2;
  char **ppcVar3;
  long lVar4;
  int extCount;
  char fileExtLower [16];
  int local_3c;
  char local_38 [24];
  
  pcVar2 = strrchr(fileName,0x2e);
  if (pcVar2 != (char *)0x0 && pcVar2 != fileName) {
    local_3c = 0;
    ppcVar3 = TextSplit(ext,';',&local_3c);
    local_38[0] = '\0';
    local_38[1] = '\0';
    local_38[2] = '\0';
    local_38[3] = '\0';
    local_38[4] = '\0';
    local_38[5] = '\0';
    local_38[6] = '\0';
    local_38[7] = '\0';
    local_38[8] = '\0';
    local_38[9] = '\0';
    local_38[10] = '\0';
    local_38[0xb] = '\0';
    local_38[0xc] = '\0';
    local_38[0xd] = '\0';
    local_38[0xe] = '\0';
    local_38[0xf] = '\0';
    pcVar2 = TextToLower(pcVar2);
    strcpy(local_38,pcVar2);
    if (0 < local_3c) {
      lVar4 = 0;
      do {
        pcVar2 = TextToLower(ppcVar3[lVar4]);
        _Var1 = TextIsEqual(local_38,pcVar2);
        if (_Var1) {
          return _Var1;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < local_3c);
      return _Var1;
    }
  }
  return false;
}

Assistant:

bool IsFileExtension(const char *fileName, const char *ext)
{
    bool result = false;
    const char *fileExt = GetFileExtension(fileName);

    if (fileExt != NULL)
    {
#if defined(SUPPORT_TEXT_MANIPULATION)
        int extCount = 0;
        const char **checkExts = TextSplit(ext, ';', &extCount);

        char fileExtLower[16] = { 0 };
        strcpy(fileExtLower, TextToLower(fileExt));

        for (int i = 0; i < extCount; i++)
        {
            if (TextIsEqual(fileExtLower, TextToLower(checkExts[i])))
            {
                result = true;
                break;
            }
        }
#else
        if (strcmp(fileExt, ext) == 0) result = true;
#endif
    }

    return result;
}